

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_setroottable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQObjectPtr *pSVar5;
  SQRESULT SVar6;
  
  pSVar5 = SQVM::GetUp(v,-1);
  SVar2 = (pSVar5->super_SQObject)._type;
  if ((SVar2 == OT_TABLE) || (SVar2 == OT_NULL)) {
    SVar3 = (v->_roottable).super_SQObject._type;
    pSVar4 = (v->_roottable).super_SQObject._unVal.pTable;
    (v->_roottable).super_SQObject._unVal = (pSVar5->super_SQObject)._unVal;
    (v->_roottable).super_SQObject._type = SVar2;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(((v->_roottable).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SQVM::Pop(v);
    SVar6 = 0;
  }
  else {
    sq_throwerror(v,"invalid type");
    SVar6 = -1;
  }
  return SVar6;
}

Assistant:

SQRESULT sq_setroottable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o) || sq_isnull(o)) {
        v->_roottable = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type"));
}